

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O3

bool Js::JavascriptStackWalker::TryIsTopJavaScriptFrameNative
               (ScriptContext *scriptContext,bool *isNative,bool ignoreLibraryCode)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  InterpreterStackFrame *pIVar5;
  undefined1 local_d8 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *caller;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x4cc,"(scriptContext)","scriptContext");
    if (!bVar2) goto LAB_00aeef9a;
    *puVar4 = 0;
  }
  if (isNative == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                ,0x4cd,"(isNative)","isNative");
    if (!bVar2) {
LAB_00aeef9a:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  JavascriptStackWalker((JavascriptStackWalker *)local_d8,scriptContext,true,(PVOID)0x0,false);
  if (ignoreLibraryCode) {
    iVar3 = GetNonLibraryCodeCaller
                      ((JavascriptStackWalker *)local_d8,
                       (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight);
  }
  else {
    iVar3 = GetCaller((JavascriptStackWalker *)local_d8,
                      (JavascriptFunction **)&walker.currentFrame.stackCheckCodeHeight,true);
  }
  if (iVar3 != 0) {
    pIVar5 = GetCurrentInterpreterFrame((JavascriptStackWalker *)local_d8);
    *isNative = pIVar5 == (InterpreterStackFrame *)0x0;
  }
  ~JavascriptStackWalker((JavascriptStackWalker *)local_d8);
  return SUB41(iVar3,0);
}

Assistant:

bool JavascriptStackWalker::TryIsTopJavaScriptFrameNative(ScriptContext* scriptContext, bool* isNative, bool ignoreLibraryCode /* = false */)
    {
        Assert(scriptContext);
        Assert(isNative);

        Js::JavascriptFunction* caller;
        Js::JavascriptStackWalker walker(scriptContext);

        BOOL isSuccess;
        if (ignoreLibraryCode)
        {
            isSuccess = walker.GetNonLibraryCodeCaller(&caller);
        }
        else
        {
            isSuccess = walker.GetCaller(&caller);
        }

        if (isSuccess)
        {
            *isNative = (walker.GetCurrentInterpreterFrame() == NULL);
            return true;
        }
        return false;
    }